

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O1

void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result,uint8_t *scalar,uint64_t *q1)

{
  uint64_t *a;
  uint uVar1;
  uint64_t yi_3;
  uint64_t b0;
  uint64_t swap1;
  uint64_t b0_1;
  ulong uVar2;
  ulong uVar3;
  uint64_t yi;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uint64_t *nqpq;
  uint64_t *tmp5;
  uint64_t local_3c8;
  long lStack_3c0;
  long local_3b8;
  long lStack_3b0;
  long local_3a8;
  ulong local_3a0;
  long lStack_398;
  ulong local_390;
  ulong uStack_388;
  ulong local_380;
  ulong local_378;
  uint64_t uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong local_350;
  long lStack_348;
  long local_340;
  long lStack_338;
  long local_330;
  uint64_t local_328;
  long lStack_320;
  long local_318;
  long lStack_310;
  long local_308;
  uint64_t local_300;
  long lStack_2f8;
  long local_2f0;
  long lStack_2e8;
  long local_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  uint64_t local_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  uint64_t local_288;
  ulong local_280;
  ulong uStack_278;
  ulong local_270;
  ulong uStack_268;
  ulong local_260;
  ulong uStack_258;
  ulong local_250;
  ulong uStack_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  uint64_t *local_58;
  ulong *local_50;
  uint64_t *local_48;
  uint8_t *local_40;
  ulong local_38;
  
  local_58 = result;
  local_40 = scalar;
  memset(&local_2d8,0,0x280);
  local_2b0 = 1;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 1;
  local_280 = 0;
  uStack_278 = 0;
  local_270 = 0;
  uStack_268 = 0;
  local_260 = 0;
  uStack_258 = 0;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 0;
  local_50 = &local_238;
  memcpy(&local_238,q1,0xa0);
  local_48 = &local_328;
  uVar1 = 0xff;
  do {
    uVar5 = -(ulong)((local_40[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0);
    uVar2 = (local_238 ^ local_2d8) & uVar5;
    uVar3 = (local_230 ^ uStack_2d0) & uVar5;
    local_2d8 = local_2d8 ^ uVar2;
    local_238 = uVar2 ^ local_238;
    uVar6 = (local_228 ^ local_2c8) & uVar5;
    uStack_2d0 = uStack_2d0 ^ uVar3;
    local_230 = uVar3 ^ local_230;
    uVar2 = (local_220 ^ uStack_2c0) & uVar5;
    local_2c8 = local_2c8 ^ uVar6;
    local_228 = uVar6 ^ local_228;
    uVar3 = (local_218 ^ local_2b8) & uVar5;
    uStack_2c0 = uStack_2c0 ^ uVar2;
    local_220 = uVar2 ^ local_220;
    local_2b8 = local_2b8 ^ uVar3;
    local_218 = uVar3 ^ local_218;
    uVar2 = (local_210 ^ local_2b0) & uVar5;
    uVar3 = (local_208 ^ local_2a8) & uVar5;
    uVar4 = local_2b0 ^ uVar2;
    local_210 = uVar2 ^ local_210;
    uVar6 = (local_200 ^ uStack_2a0) & uVar5;
    local_2a8 = local_2a8 ^ uVar3;
    local_208 = uVar3 ^ local_208;
    uVar2 = (local_1f8 ^ local_298) & uVar5;
    uStack_2a0 = uStack_2a0 ^ uVar6;
    local_200 = uVar6 ^ local_200;
    uVar3 = (local_1f0 ^ uStack_290) & uVar5;
    local_298 = local_298 ^ uVar2;
    local_1f8 = uVar2 ^ local_1f8;
    uStack_290 = uStack_290 ^ uVar3;
    local_1f0 = uVar3 ^ local_1f0;
    uVar2 = (local_1e8 ^ local_288) & uVar5;
    local_288 = local_288 ^ uVar2;
    local_1e8 = uVar2 ^ local_1e8;
    uVar2 = (local_1e0 ^ local_280) & uVar5;
    local_280 = local_280 ^ uVar2;
    local_1e0 = uVar2 ^ local_1e0;
    uVar2 = (local_1d8 ^ uStack_278) & uVar5;
    uStack_278 = uStack_278 ^ uVar2;
    local_1d8 = uVar2 ^ local_1d8;
    uVar2 = (local_1d0 ^ local_270) & uVar5;
    local_270 = local_270 ^ uVar2;
    local_1d0 = uVar2 ^ local_1d0;
    uVar2 = (local_1c8 ^ uStack_268) & uVar5;
    uStack_268 = uStack_268 ^ uVar2;
    local_1c8 = uVar2 ^ local_1c8;
    uVar2 = (local_1c0 ^ local_260) & uVar5;
    local_260 = local_260 ^ uVar2;
    local_1c0 = uVar2 ^ local_1c0;
    uVar2 = (local_1b8 ^ uStack_258) & uVar5;
    uStack_258 = uStack_258 ^ uVar2;
    local_1b8 = uVar2 ^ local_1b8;
    uVar2 = (local_1b0 ^ local_250) & uVar5;
    local_250 = local_250 ^ uVar2;
    local_1b0 = uVar2 ^ local_1b0;
    uVar2 = (local_1a8 ^ uStack_248) & uVar5;
    uStack_248 = uStack_248 ^ uVar2;
    local_1a8 = uVar2 ^ local_1a8;
    uVar2 = (local_1a0 ^ local_240) & uVar5;
    local_240 = local_240 ^ uVar2;
    local_1a0 = uVar2 ^ local_1a0;
    local_2b0 = uVar4;
    memset(&local_3c8,0,0xf0);
    Hacl_Bignum25519_fsquare(&local_3c8,&local_2d8);
    Hacl_Bignum25519_fsquare(&local_3a0,&local_2b0);
    Hacl_Bignum25519_fsquare(&local_378,&local_288);
    a = local_48;
    local_330 = local_358 * 2;
    local_350 = local_378 * 2;
    lStack_348 = uStack_370 * 2;
    local_340 = local_368 * 2;
    lStack_338 = uStack_360 * 2;
    uVar2 = lStack_398 + lStack_3c0 + (local_3a0 + local_3c8 >> 0x33);
    local_368 = local_390 + local_3b8 + (uVar2 >> 0x33);
    uStack_360 = uStack_388 + lStack_3b0 + (local_368 >> 0x33);
    local_368 = local_368 & 0x7ffffffffffff;
    uVar3 = (uStack_360 >> 0x33) + local_380 + local_3a8;
    uStack_360 = uStack_360 & 0x7ffffffffffff;
    local_358 = uVar3 & 0x7ffffffffffff;
    uVar3 = (uVar3 >> 0x33) * 0x13 + (local_3a0 + local_3c8 & 0x7ffffffffffff);
    local_378 = uVar3 & 0x7ffffffffffff;
    uStack_370 = (uVar3 >> 0x33) + (uVar2 & 0x7ffffffffffff);
    local_48[4] = local_2b8;
    uVar6 = uStack_2c0;
    uVar3 = uStack_2d0;
    uVar2 = local_2d8;
    a[2] = local_2c8;
    a[3] = uVar6;
    *a = uVar2;
    a[1] = uVar3;
    local_328 = local_328 + uVar4;
    lStack_320 = lStack_320 + local_2a8;
    local_318 = local_318 + uStack_2a0;
    lStack_310 = lStack_310 + local_298;
    local_308 = local_308 + uStack_290;
    Hacl_Bignum25519_fsquare(&local_300,a);
    a[4] = local_358;
    a[2] = local_368;
    a[3] = uStack_360;
    *a = local_378;
    a[1] = uStack_370;
    local_300 = (local_328 - local_300) + 0x3fffffffffff68;
    lStack_2f8 = (lStack_320 - lStack_2f8) + 0x3ffffffffffff8;
    local_2f0 = (local_318 - local_2f0) + 0x3ffffffffffff8;
    lStack_2e8 = (lStack_310 - lStack_2e8) + 0x3ffffffffffff8;
    local_2e0 = (local_308 + 0x3ffffffffffff8) - local_2e0;
    uVar6 = (local_3c8 - local_3a0) + 0x3fffffffffff68;
    uVar3 = (lStack_3c0 - lStack_398) + 0x3ffffffffffff8 + (uVar6 >> 0x33);
    local_390 = (local_3b8 - local_390) + 0x3ffffffffffff8 + (uVar3 >> 0x33);
    uStack_388 = (lStack_3b0 - uStack_388) + 0x3ffffffffffff8 + (local_390 >> 0x33);
    local_390 = local_390 & 0x7ffffffffffff;
    uVar2 = (uStack_388 >> 0x33) + ((local_3a8 + 0x3ffffffffffff8) - local_380);
    uStack_388 = uStack_388 & 0x7ffffffffffff;
    local_380 = uVar2 & 0x7ffffffffffff;
    uVar2 = (uVar2 >> 0x33) * 0x13 + (uVar6 & 0x7ffffffffffff);
    local_3a0 = uVar2 & 0x7ffffffffffff;
    lStack_398 = (uVar2 >> 0x33) + (uVar3 & 0x7ffffffffffff);
    uVar2 = (local_350 >> 0x33) + lStack_348;
    uVar3 = (uVar2 >> 0x33) + local_340;
    uVar6 = (uVar3 >> 0x33) + lStack_338;
    uVar4 = (uVar6 >> 0x33) + local_330;
    uVar7 = (uVar4 >> 0x33) * 0x13 + (local_350 & 0x7ffffffffffff);
    local_350 = (uVar7 & 0x7ffffffffffff) + local_3a0;
    lStack_348 = (uVar2 & 0x7ffffffffffff) + lStack_398 + (uVar7 >> 0x33);
    local_340 = (uVar3 & 0x7ffffffffffff) + local_390;
    lStack_338 = (uVar6 & 0x7ffffffffffff) + uStack_388;
    local_330 = (uVar4 & 0x7ffffffffffff) + local_380;
    Hacl_Bignum25519_fmul(&local_198,&local_350,&local_300);
    Hacl_Bignum25519_fmul(&local_170,&local_3a0,&local_378);
    Hacl_Bignum25519_fmul(&local_120,&local_378,&local_300);
    Hacl_Bignum25519_fmul(&local_148,&local_350,&local_3a0);
    Hacl_Impl_Ed25519_PointAdd_point_add(&local_f8,&local_2d8,local_50);
    local_238 = (local_f8 ^ local_198) & uVar5;
    local_230 = (local_f0 ^ local_190) & uVar5;
    local_228 = (local_e8 ^ local_188) & uVar5;
    local_220 = (local_e0 ^ local_180) & uVar5;
    local_2d8 = local_198 ^ local_238;
    local_238 = local_238 ^ local_f8;
    local_218 = (local_d8 ^ local_178) & uVar5;
    uStack_2d0 = local_190 ^ local_230;
    local_230 = local_230 ^ local_f0;
    local_2c8 = local_188 ^ local_228;
    local_228 = local_228 ^ local_e8;
    uStack_2c0 = local_180 ^ local_220;
    local_220 = local_220 ^ local_e0;
    local_2b8 = local_178 ^ local_218;
    local_218 = local_218 ^ local_d8;
    local_210 = (local_d0 ^ local_170) & uVar5;
    local_208 = (local_c8 ^ local_168) & uVar5;
    local_200 = (local_c0 ^ local_160) & uVar5;
    local_1f8 = (local_b8 ^ local_158) & uVar5;
    local_2b0 = local_170 ^ local_210;
    local_210 = local_210 ^ local_d0;
    local_1f0 = (local_b0 ^ local_150) & uVar5;
    local_2a8 = local_168 ^ local_208;
    local_208 = local_208 ^ local_c8;
    uStack_2a0 = local_160 ^ local_200;
    local_200 = local_200 ^ local_c0;
    local_298 = local_158 ^ local_1f8;
    local_1f8 = local_1f8 ^ local_b8;
    uStack_290 = local_150 ^ local_1f0;
    local_1f0 = local_1f0 ^ local_b0;
    local_1e8 = (local_a8 ^ local_148) & uVar5;
    local_1e0 = (local_a0 ^ local_140) & uVar5;
    local_1d8 = (local_98 ^ local_138) & uVar5;
    local_1d0 = (local_90 ^ local_130) & uVar5;
    local_288 = local_148 ^ local_1e8;
    local_1e8 = local_1e8 ^ local_a8;
    local_1c8 = (local_88 ^ local_128) & uVar5;
    local_280 = local_140 ^ local_1e0;
    local_1e0 = local_1e0 ^ local_a0;
    uStack_278 = local_138 ^ local_1d8;
    local_1d8 = local_1d8 ^ local_98;
    local_270 = local_130 ^ local_1d0;
    local_1d0 = local_1d0 ^ local_90;
    uStack_268 = local_128 ^ local_1c8;
    local_1c8 = local_1c8 ^ local_88;
    local_38 = local_68;
    local_1c0 = (local_80 ^ local_120) & uVar5;
    local_1b8 = (local_78 ^ local_118) & uVar5;
    local_1b0 = (local_70 ^ local_110) & uVar5;
    local_1a8 = (local_68 ^ local_108) & uVar5;
    uVar5 = (local_60 ^ local_100) & uVar5;
    local_260 = local_120 ^ local_1c0;
    local_1c0 = local_1c0 ^ local_80;
    uStack_258 = local_118 ^ local_1b8;
    local_1b8 = local_1b8 ^ local_78;
    local_250 = local_110 ^ local_1b0;
    local_1b0 = local_1b0 ^ local_70;
    uStack_248 = local_108 ^ local_1a8;
    local_1a8 = local_1a8 ^ local_68;
    local_240 = local_100 ^ uVar5;
    local_1a0 = uVar5 ^ local_60;
    bVar8 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar8);
  memcpy(local_58,&local_2d8,0xa0);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result, uint8_t *scalar, uint64_t *q1)
{
  uint64_t b[80U] = { 0U };
  uint64_t *nq = b;
  uint64_t *nqpq = b + (uint32_t)20U;
  Hacl_Impl_Ed25519_Ladder_make_point_inf(nq);
  Hacl_Impl_Ed25519_SwapConditional_copy(nqpq, q1);
  Hacl_Impl_Ed25519_Ladder_point_mul_(b, scalar);
  Hacl_Impl_Ed25519_SwapConditional_copy(result, nq);
}